

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemInterface::handleTouchEvent<QWindowSystemInterface::SynchronousDelivery>
               (QWindow *window,ulong timestamp,QPointingDevice *device,
               QList<QWindowSystemInterface::TouchPoint> *points,KeyboardModifiers mods)

{
  bool bVar1;
  long in_FS_OFFSET;
  Type type;
  QArrayDataPointer<QEventPoint> local_70;
  QArrayDataPointer<QEventPoint> local_58;
  Type local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((points->d).size != 0) {
    bVar1 = QInputDevicePrivate::isRegistered(&device->super_QInputDevice);
    if (bVar1) {
      local_3c = 0xaaaaaaaa;
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QEventPoint *)&DAT_aaaaaaaaaaaaaaaa;
      QWindowSystemInterfacePrivate::fromNativeTouchPoints
                ((QList<QEventPoint> *)&local_58,points,window,&local_3c);
      local_70.d = local_58.d;
      local_70.ptr = local_58.ptr;
      local_70.size = local_58.size;
      if (local_58.d != (Data *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      bVar1 = handleWindowSystemEvent<QWindowSystemInterfacePrivate::TouchEvent,QWindowSystemInterface::SynchronousDelivery,QWindow*,unsigned_long,QEvent::Type,QPointingDevice_const*,QList<QEventPoint>,QFlags<Qt::KeyboardModifier>>
                        (window,timestamp,local_3c,device,(QList<QEventPoint> *)&local_70,
                         (QFlags<Qt::KeyboardModifier>)
                         mods.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                         super_QFlagsStorage<Qt::KeyboardModifier>.i);
      QArrayDataPointer<QEventPoint>::~QArrayDataPointer(&local_70);
      QArrayDataPointer<QEventPoint>::~QArrayDataPointer(&local_58);
      goto LAB_002fb690;
    }
  }
  bVar1 = false;
LAB_002fb690:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

QT_DEFINE_QPA_EVENT_HANDLER(bool, handleTouchEvent, QWindow *window, ulong timestamp, const QPointingDevice *device,
                                              const QList<TouchPoint> &points, Qt::KeyboardModifiers mods)
{
    if (!points.size()) // Touch events must have at least one point
        return false;

    if (!QPointingDevicePrivate::isRegistered(device)) // Disallow passing bogus, non-registered devices.
        return false;

    QEvent::Type type;
    QList<QEventPoint> touchPoints =
            QWindowSystemInterfacePrivate::fromNativeTouchPoints(points, window, &type);

    return handleWindowSystemEvent<QWindowSystemInterfacePrivate::TouchEvent, Delivery>(window,
        timestamp, type, device, touchPoints, mods);
}